

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkRayTracingPipelineCreateInfoKHR *pipe,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  bool bVar1;
  unsigned_long uVar2;
  GenericStringRef<char> local_1d8;
  GenericStringRef<char> local_1c8;
  GenericStringRef<char> local_1b8;
  GenericStringRef<char> local_1a8;
  GenericStringRef<char> local_198;
  GenericStringRef<char> local_188;
  undefined1 local_178 [8];
  Value group;
  undefined1 local_160 [4];
  uint32_t i;
  Value groups;
  undefined1 local_140 [8];
  Value library_info;
  GenericStringRef<char> local_120;
  GenericStringRef<char> local_110;
  undefined1 local_100 [8];
  Value iface;
  undefined1 local_e0 [8];
  Value stages;
  undefined1 local_b8 [8];
  Value dyn;
  GenericStringRef<char> local_98;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_88;
  GenericStringRef<char> local_78;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_68;
  GenericStringRef<char> local_58;
  GenericStringRef<char> local_48;
  undefined1 local_38 [8];
  Value p;
  Value *out_value_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkRayTracingPipelineCreateInfoKHR *pipe_local;
  
  p.data_.o.members = (Member *)out_value;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_38,kObjectType);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_48,(char (*) [6])"flags");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,&local_48,pipe->flags,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_58,(char (*) [7])0x1f1192);
  uVar2 = api_object_cast<unsigned_long,VkPipelineLayout_T*>(pipe->layout);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&local_68,uVar2,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_38,&local_58,&local_68,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_68);
  rapidjson::GenericStringRef<char>::GenericStringRef<19u>
            (&local_78,(char (*) [19])"basePipelineHandle");
  uVar2 = api_object_cast<unsigned_long,VkPipeline_T*>(pipe->basePipelineHandle);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&local_88,uVar2,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_38,&local_78,&local_88,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_88);
  rapidjson::GenericStringRef<char>::GenericStringRef<18u>
            (&local_98,(char (*) [18])"basePipelineIndex");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_38,&local_98,pipe->basePipelineIndex,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<29u>
            ((GenericStringRef<char> *)((long)&dyn.data_ + 8),
             (char (*) [29])"maxPipelineRayRecursionDepth");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_38,(StringRefType *)((long)&dyn.data_ + 8),pipe->maxPipelineRayRecursionDepth,
             alloc);
  if (pipe->pDynamicState != (VkPipelineDynamicStateCreateInfo *)0x0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_b8);
    bVar1 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (pipe->pDynamicState,alloc,(Value *)local_b8);
    if (bVar1) {
      rapidjson::GenericStringRef<char>::GenericStringRef<13u>
                ((GenericStringRef<char> *)((long)&stages.data_ + 8),(char (*) [13])"dynamicState");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_38,(StringRefType *)((long)&stages.data_ + 8),
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_b8,alloc);
    }
    else {
      pipe_local._7_1_ = 0;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_b8);
    if (!bVar1) goto LAB_0015e02e;
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_e0);
  bVar1 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    (pipe->pStages,pipe->stageCount,alloc,(Value *)local_e0);
  if (bVar1) {
    rapidjson::GenericStringRef<char>::GenericStringRef<7u>
              ((GenericStringRef<char> *)((long)&iface.data_ + 8),(char (*) [7])"stages");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_38,(StringRefType *)((long)&iface.data_ + 8),
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_e0,alloc);
    if (pipe->pLibraryInterface != (VkRayTracingPipelineInterfaceCreateInfoKHR *)0x0) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_100,kObjectType);
      rapidjson::GenericStringRef<char>::GenericStringRef<26u>
                (&local_110,(char (*) [26])"maxPipelineRayPayloadSize");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_100,&local_110,pipe->pLibraryInterface->maxPipelineRayPayloadSize,alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<31u>
                (&local_120,(char (*) [31])"maxPipelineRayHitAttributeSize");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_100,&local_120,pipe->pLibraryInterface->maxPipelineRayHitAttributeSize,
                 alloc);
      bVar1 = pnext_chain_add_json_value<VkRayTracingPipelineInterfaceCreateInfoKHR,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((Value *)local_100,pipe->pLibraryInterface,alloc,(DynamicStateInfo *)0x0);
      if (bVar1) {
        rapidjson::GenericStringRef<char>::GenericStringRef<17u>
                  ((GenericStringRef<char> *)((long)&library_info.data_ + 8),
                   (char (*) [17])"libraryInterface");
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_38,(StringRefType *)((long)&library_info.data_ + 8),
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_100,alloc);
      }
      else {
        pipe_local._7_1_ = 0;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_100);
      if (!bVar1) goto LAB_0015e022;
    }
    if (pipe->pLibraryInfo != (VkPipelineLibraryCreateInfoKHR *)0x0) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_140);
      bVar1 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (pipe->pLibraryInfo,alloc,false,(Value *)local_140);
      if (bVar1) {
        rapidjson::GenericStringRef<char>::GenericStringRef<12u>
                  ((GenericStringRef<char> *)((long)&groups.data_ + 8),(char (*) [12])"libraryInfo")
        ;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_38,(StringRefType *)((long)&groups.data_ + 8),
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_140,alloc);
      }
      else {
        pipe_local._7_1_ = 0;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_140);
      if (!bVar1) goto LAB_0015e022;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_160,kArrayType);
    for (group.data_._12_4_ = 0; (uint)group.data_._12_4_ < pipe->groupCount;
        group.data_._12_4_ = group.data_._12_4_ + 1) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_178,kObjectType);
      rapidjson::GenericStringRef<char>::GenericStringRef<13u>
                (&local_188,(char (*) [13])"anyHitShader");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_178,&local_188,pipe->pGroups[(uint)group.data_._12_4_].anyHitShader,alloc)
      ;
      rapidjson::GenericStringRef<char>::GenericStringRef<19u>
                (&local_198,(char (*) [19])"intersectionShader");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_178,&local_198,pipe->pGroups[(uint)group.data_._12_4_].intersectionShader,
                 alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<14u>
                (&local_1a8,(char (*) [14])"generalShader");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_178,&local_1a8,pipe->pGroups[(uint)group.data_._12_4_].generalShader,alloc
                );
      rapidjson::GenericStringRef<char>::GenericStringRef<17u>
                (&local_1b8,(char (*) [17])"closestHitShader");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_178,&local_1b8,pipe->pGroups[(uint)group.data_._12_4_].closestHitShader,
                 alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_1c8,(char (*) [5])"type");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkRayTracingShaderGroupTypeKHR>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_178,&local_1c8,pipe->pGroups[(uint)group.data_._12_4_].type,alloc);
      bVar1 = pnext_chain_add_json_value<VkRayTracingShaderGroupCreateInfoKHR,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        ((Value *)local_178,pipe->pGroups + (uint)group.data_._12_4_,alloc,
                         (DynamicStateInfo *)0x0);
      if (bVar1) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_160,
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_178,alloc);
      }
      else {
        pipe_local._7_1_ = 0;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_178);
      if (!bVar1) goto LAB_0015e016;
    }
    rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_1d8,(char (*) [7])"groups");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_38,&local_1d8,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_160,alloc);
    bVar1 = pnext_chain_add_json_value<VkRayTracingPipelineCreateInfoKHR,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ((Value *)local_38,pipe,alloc,(DynamicStateInfo *)0x0);
    if (bVar1) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::operator=(p.data_.a.elements,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_38);
      pipe_local._7_1_ = 1;
    }
    else {
      pipe_local._7_1_ = 0;
    }
LAB_0015e016:
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_160);
  }
  else {
    pipe_local._7_1_ = 0;
  }
LAB_0015e022:
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_e0);
LAB_0015e02e:
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_38);
  return (bool)(pipe_local._7_1_ & 1);
}

Assistant:

static bool json_value(const VkRayTracingPipelineCreateInfoKHR &pipe, Allocator &alloc, Value *out_value)
{
	Value p(kObjectType);
	p.AddMember("flags", pipe.flags, alloc);
	p.AddMember("layout", uint64_string(api_object_cast<uint64_t>(pipe.layout), alloc), alloc);
	p.AddMember("basePipelineHandle", uint64_string(api_object_cast<uint64_t>(pipe.basePipelineHandle), alloc), alloc);
	p.AddMember("basePipelineIndex", pipe.basePipelineIndex, alloc);
	p.AddMember("maxPipelineRayRecursionDepth", pipe.maxPipelineRayRecursionDepth, alloc);

	if (pipe.pDynamicState)
	{
		Value dyn;
		if (!json_value(*pipe.pDynamicState, alloc, &dyn))
			return false;
		p.AddMember("dynamicState", dyn, alloc);
	}

	Value stages;
	if (!json_value(pipe.pStages, pipe.stageCount, alloc, &stages))
		return false;
	p.AddMember("stages", stages, alloc);

	if (pipe.pLibraryInterface)
	{
		Value iface(kObjectType);
		iface.AddMember("maxPipelineRayPayloadSize", pipe.pLibraryInterface->maxPipelineRayPayloadSize, alloc);
		iface.AddMember("maxPipelineRayHitAttributeSize", pipe.pLibraryInterface->maxPipelineRayHitAttributeSize, alloc);
		if (!pnext_chain_add_json_value(iface, *pipe.pLibraryInterface, alloc, nullptr))
			return false;
		p.AddMember("libraryInterface", iface, alloc);
	}

	if (pipe.pLibraryInfo)
	{
		Value library_info;
		if (!json_value(*pipe.pLibraryInfo, alloc, false, &library_info))
			return false;
		p.AddMember("libraryInfo", library_info, alloc);
	}

	Value groups(kArrayType);
	for (uint32_t i = 0; i < pipe.groupCount; i++)
	{
		Value group(kObjectType);
		group.AddMember("anyHitShader", pipe.pGroups[i].anyHitShader, alloc);
		group.AddMember("intersectionShader", pipe.pGroups[i].intersectionShader, alloc);
		group.AddMember("generalShader", pipe.pGroups[i].generalShader, alloc);
		group.AddMember("closestHitShader", pipe.pGroups[i].closestHitShader, alloc);
		group.AddMember("type", pipe.pGroups[i].type, alloc);
		if (!pnext_chain_add_json_value(group, pipe.pGroups[i], alloc, nullptr))
			return false;
		groups.PushBack(group, alloc);
	}
	p.AddMember("groups", groups, alloc);

	if (!pnext_chain_add_json_value(p, pipe, alloc, nullptr))
		return false;

	*out_value = p;
	return true;
}